

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O0

void Pdr_ManPrintCex(Aig_Man_t *pAig,Vec_Int_t *vCiObjs,Vec_Int_t *vCiVals,Vec_Int_t *vCi2Rem)

{
  undefined1 uVar1;
  int iVar2;
  void *__ptr;
  Aig_Obj_t *pAVar3;
  char *pBuff;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vCi2Rem_local;
  Vec_Int_t *vCiVals_local;
  Vec_Int_t *vCiObjs_local;
  Aig_Man_t *pAig_local;
  
  iVar2 = Aig_ManCiNum(pAig);
  __ptr = malloc((long)(iVar2 + 1));
  for (pBuff._4_4_ = 0; iVar2 = Aig_ManCiNum(pAig), pBuff._4_4_ < iVar2;
      pBuff._4_4_ = pBuff._4_4_ + 1) {
    *(undefined1 *)((long)__ptr + (long)pBuff._4_4_) = 0x2d;
  }
  *(undefined1 *)((long)__ptr + (long)pBuff._4_4_) = 0;
  for (pBuff._4_4_ = 0; iVar2 = Vec_IntSize(vCiObjs), pBuff._4_4_ < iVar2;
      pBuff._4_4_ = pBuff._4_4_ + 1) {
    iVar2 = Vec_IntEntry(vCiObjs,pBuff._4_4_);
    pAVar3 = Aig_ManObj(pAig,iVar2);
    iVar2 = Vec_IntEntry(vCiVals,pBuff._4_4_);
    uVar1 = 0x30;
    if (iVar2 != 0) {
      uVar1 = 0x31;
    }
    iVar2 = Aig_ObjCioId(pAVar3);
    *(undefined1 *)((long)__ptr + (long)iVar2) = uVar1;
  }
  if (vCi2Rem != (Vec_Int_t *)0x0) {
    for (pBuff._4_4_ = 0; iVar2 = Vec_IntSize(vCi2Rem), pBuff._4_4_ < iVar2;
        pBuff._4_4_ = pBuff._4_4_ + 1) {
      iVar2 = Vec_IntEntry(vCi2Rem,pBuff._4_4_);
      pAVar3 = Aig_ManObj(pAig,iVar2);
      iVar2 = Aig_ObjCioId(pAVar3);
      *(undefined1 *)((long)__ptr + (long)iVar2) = 0x78;
    }
  }
  Abc_Print(1,"%s\n",__ptr);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Pdr_ManPrintCex( Aig_Man_t * pAig, Vec_Int_t * vCiObjs, Vec_Int_t * vCiVals, Vec_Int_t * vCi2Rem )
{
    Aig_Obj_t * pObj;
    int i;
    char * pBuff = ABC_ALLOC( char, Aig_ManCiNum(pAig)+1 );
    for ( i = 0; i < Aig_ManCiNum(pAig); i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    Aig_ManForEachObjVec( vCiObjs, pAig, pObj, i )
        pBuff[Aig_ObjCioId(pObj)] = (Vec_IntEntry(vCiVals, i)? '1':'0');
    if ( vCi2Rem )
    Aig_ManForEachObjVec( vCi2Rem, pAig, pObj, i )
        pBuff[Aig_ObjCioId(pObj)] = 'x';
    Abc_Print( 1, "%s\n", pBuff );
    ABC_FREE( pBuff );
}